

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlib.c
# Opt level: O0

void cvprod(float *a,float *b,float *out,long N)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float *pfVar17;
  float *pfVar18;
  float local_88;
  float local_84;
  float T3I;
  float T3R;
  float T2I;
  float T2R;
  float T1I;
  float T1R;
  float T0I;
  float T0R;
  float B3I;
  float B3R;
  float B2I;
  float B2R;
  float B1I;
  float B1R;
  float B0I;
  float B0R;
  float A3I;
  float A3R;
  float A2I;
  float A2R;
  float A1I;
  float A1R;
  float A0I;
  float A0R;
  long OutCnt;
  long N_local;
  float *out_local;
  float *b_local;
  
  N_local = (long)out;
  out_local = b;
  b_local = a;
  if (3 < N) {
    T1R = *a * *b - a[1] * b[1];
    T1I = a[1] * *b + *a * b[1];
    T2R = a[2] * b[2] - a[3] * b[3];
    T2I = a[3] * b[2] + a[2] * b[3];
    T3R = a[4] * b[4] - a[5] * b[5];
    T3I = a[5] * b[4] + a[4] * b[5];
    local_84 = a[6] * b[6] - a[7] * b[7];
    local_88 = a[7] * b[6] + a[6] * b[7];
    _A0I = N / 4;
    out_local = b;
    b_local = a;
    while (_A0I = _A0I + -1, 0 < _A0I) {
      fVar1 = b_local[8];
      fVar2 = out_local[8];
      fVar3 = b_local[9];
      fVar4 = out_local[9];
      fVar5 = b_local[10];
      fVar6 = out_local[10];
      fVar7 = b_local[0xb];
      fVar8 = out_local[0xb];
      fVar9 = b_local[0xc];
      fVar10 = out_local[0xc];
      fVar11 = b_local[0xd];
      fVar12 = out_local[0xd];
      fVar13 = b_local[0xe];
      fVar14 = out_local[0xe];
      fVar15 = b_local[0xf];
      fVar16 = out_local[0xf];
      *(float *)N_local = T1R;
      *(float *)(N_local + 4) = T1I;
      *(float *)(N_local + 8) = T2R;
      *(float *)(N_local + 0xc) = T2I;
      *(float *)(N_local + 0x10) = T3R;
      *(float *)(N_local + 0x14) = T3I;
      *(float *)(N_local + 0x18) = local_84;
      *(float *)(N_local + 0x1c) = local_88;
      T1R = fVar1 * fVar2 - fVar3 * fVar4;
      T1I = fVar3 * fVar2 + fVar1 * fVar4;
      T2R = fVar5 * fVar6 - fVar7 * fVar8;
      T2I = fVar7 * fVar6 + fVar5 * fVar8;
      T3R = fVar9 * fVar10 - fVar11 * fVar12;
      T3I = fVar11 * fVar10 + fVar9 * fVar12;
      local_84 = fVar13 * fVar14 - fVar15 * fVar16;
      local_88 = fVar15 * fVar14 + fVar13 * fVar16;
      N_local = N_local + 0x20;
      out_local = out_local + 8;
      b_local = b_local + 8;
    }
    b_local = b_local + 8;
    out_local = out_local + 8;
    *(float *)N_local = T1R;
    *(float *)(N_local + 4) = T1I;
    *(float *)(N_local + 8) = T2R;
    *(float *)(N_local + 0xc) = T2I;
    *(float *)(N_local + 0x10) = T3R;
    *(float *)(N_local + 0x14) = T3I;
    *(float *)(N_local + 0x18) = local_84;
    *(float *)(N_local + 0x1c) = local_88;
    N_local = N_local + 0x20;
  }
  for (_A0I = N % 4; 0 < _A0I; _A0I = _A0I + -1) {
    pfVar18 = b_local + 1;
    fVar1 = *b_local;
    pfVar17 = out_local + 1;
    fVar2 = *out_local;
    b_local = b_local + 2;
    fVar3 = *pfVar18;
    out_local = out_local + 2;
    fVar4 = *pfVar17;
    pfVar18 = (float *)(N_local + 4);
    *(float *)N_local = fVar1 * fVar2 - fVar3 * fVar4;
    N_local = N_local + 8;
    *pfVar18 = fVar3 * fVar2 + fVar1 * fVar4;
  }
  return;
}

Assistant:

void cvprod(float *a, float *b, float *out, long N){
/* complex vector product, can be in-place */
/* product of complex vector *a times complex vector *b */
/* INPUTS */
/* N vector length */
/* *a complex vector length N complex numbers */
/* *b complex vector length N complex numbers */
/* OUTPUTS */
/* *out complex vector length N */

long	OutCnt;		/* output counter */
float	A0R; 		/* A storage */
float	A0I; 		/* A storage */
float	A1R; 		/* A storage */
float	A1I; 		/* A storage */
float	A2R; 		/* A storage */
float	A2I; 		/* A storage */
float	A3R; 		/* A storage */
float	A3I; 		/* A storage */
float	B0R; 		/* B storage */
float	B0I; 		/* B storage */
float	B1R; 		/* B storage */
float	B1I; 		/* B storage */
float	B2R; 		/* B storage */
float	B2I; 		/* B storage */
float	B3R; 		/* B storage */
float	B3I; 		/* B storage */
float	T0R; 		/* TMP storage */
float	T0I; 		/* TMP storage */
float	T1R; 		/* TMP storage */
float	T1I; 		/* TMP storage */
float	T2R; 		/* TMP storage */
float	T2I; 		/* TMP storage */
float	T3R; 		/* TMP storage */
float	T3I; 		/* TMP storage */

if (N>=4){
	A0R = *a;
	B0R = *b;
	A0I = *(a +1);
	B0I = *(b +1);
	A1R = *(a +2);
	B1R = *(b +2);
	A1I = *(a +3);
	B1I = *(b +3);
	A2R = *(a +4);
	B2R = *(b +4);
	A2I = *(a +5);
	B2I = *(b +5);
	A3R = *(a +6);
	B3R = *(b +6);
	A3I = *(a +7);
	B3I = *(b +7);
	T0R = A0R * B0R;
	T0I = (A0R * B0I);
	T1R = A1R * B1R;
	T1I = (A1R * B1I);
	T2R = A2R * B2R;
	T2I = (A2R * B2I);
	T3R = A3R * B3R;
	T3I = (A3R * B3I);
	T0R -= (A0I * B0I);
	T0I = A0I * B0R + T0I;
	T1R -= (A1I * B1I);
	T1I = A1I * B1R + T1I;
	T2R -= (A2I * B2I);
	T2I = A2I * B2R + T2I;
	T3R -= (A3I * B3I);
	T3I = A3I * B3R + T3I;
	for (OutCnt=N/4-1; OutCnt > 0; OutCnt--){
		a += 8;
		b += 8;
		A0R = *a;
		B0R = *b;
		A0I = *(a +1);
		B0I = *(b +1);
		A1R = *(a +2);
		B1R = *(b +2);
		A1I = *(a +3);
		B1I = *(b +3);
		A2R = *(a +4);
		B2R = *(b +4);
		A2I = *(a +5);
		B2I = *(b +5);
		A3R = *(a +6);
		B3R = *(b +6);
		A3I = *(a +7);
		B3I = *(b +7);
		*out = T0R;
		*(out +1) = T0I;
		*(out +2) = T1R;
		*(out +3) = T1I;
		*(out +4) = T2R;
		*(out +5) = T2I;
		*(out +6) = T3R;
		*(out +7) = T3I;
		T0R = A0R * B0R;
		T0I = (A0R * B0I);
		T1R = A1R * B1R;
		T1I = (A1R * B1I);
		T2R = A2R * B2R;
		T2I = (A2R * B2I);
		T3R = A3R * B3R;
		T3I = (A3R * B3I);
		T0R -= (A0I * B0I);
		T0I = A0I * B0R + T0I;
		T1R -= (A1I * B1I);
		T1I = A1I * B1R + T1I;
		T2R -= (A2I * B2I);
		T2I = A2I * B2R + T2I;
		T3R -= (A3I * B3I);
		T3I = A3I * B3R + T3I;
		out += 8;
	}
	a += 8;
	b += 8;
	*out = T0R;
	*(out +1) = T0I;
	*(out +2) = T1R;
	*(out +3) = T1I;
	*(out +4) = T2R;
	*(out +5) = T2I;
	*(out +6) = T3R;
	*(out +7) = T3I;
	out += 8;
}
for (OutCnt=N%4; OutCnt > 0; OutCnt--){
	A0R = *a++;
	B0R = *b++;
	A0I = *a++;
	B0I = *b++;
	T0R = A0R * B0R;
	T0I = (A0R * B0I);
	T0R -= (A0I * B0I);
	T0I = A0I * B0R + T0I;
	*out++ = T0R;
	*out++ = T0I;
}
}